

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

void __thiscall GB::jp_cc_nn(GB *this,u8 mask,u8 val)

{
  u16 uVar1;
  long lVar2;
  u8 uVar3;
  
  lVar2 = (this->s).op_tick;
  if (lVar2 != 0x1e) {
    if (lVar2 != 0x16) {
      if (lVar2 != 0xe) {
        return;
      }
      uVar1 = (this->s).pc;
      (this->s).pc = uVar1 + 1;
      uVar3 = Read(this,uVar1);
      (this->s).field_6.field_0.z = uVar3;
      return;
    }
    uVar1 = (this->s).pc;
    (this->s).pc = uVar1 + 1;
    uVar3 = Read(this,uVar1);
    (this->s).field_6.field_0.w = uVar3;
    if ((mask & (this->s).field_2.field_0.f) == val) {
      (this->s).pc = (u16)(this->s).field_6;
      return;
    }
  }
  (this->s).op_tick = -2;
  return;
}

Assistant:

void GB::jp_cc_nn(u8 mask, u8 val) {
  switch (s.op_tick) {
    case 14: s.z = read_n(); break;
    case 22: s.w = read_n(); if (f_is(mask, val)) { s.pc = s.wz; } break;
    case 30: op_done(); break;
  }
}